

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O3

UBool ucm_checkValidity(UCMTable *table,UCMStates *baseStates)

{
  int iVar1;
  UCMapping *pUVar2;
  int32_t iVar3;
  UBool UVar4;
  anon_union_4_2_095b93d3_for_b *bytes;
  anon_union_4_2_095b93d3_for_b *paVar5;
  UCMapping *pUVar6;
  
  iVar1 = table->mappingsLength;
  if ((long)iVar1 < 1) {
    UVar4 = '\x01';
  }
  else {
    pUVar2 = table->mappings;
    UVar4 = '\x01';
    paVar5 = &pUVar2->b;
    do {
      bytes = paVar5;
      if (4 < *(int8_t *)((long)paVar5 + 5)) {
        bytes = (anon_union_4_2_095b93d3_for_b *)(table->bytes + paVar5->idx);
      }
      iVar3 = ucm_countChars(baseStates,bytes->bytes,(int)*(int8_t *)((long)paVar5 + 5));
      if (iVar3 < 1) {
        ucm_printMapping(table,(UCMapping *)(paVar5 + -1),_stderr);
        UVar4 = '\0';
      }
      pUVar6 = (UCMapping *)(paVar5 + 2);
      paVar5 = paVar5 + 3;
    } while (pUVar6 < pUVar2 + iVar1);
  }
  return UVar4;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_checkValidity(UCMTable *table, UCMStates *baseStates) {
    UCMapping *m, *mLimit;
    int32_t count;
    UBool isOK;

    m=table->mappings;
    mLimit=m+table->mappingsLength;
    isOK=TRUE;

    while(m<mLimit) {
        count=ucm_countChars(baseStates, UCM_GET_BYTES(table, m), m->bLen);
        if(count<1) {
            ucm_printMapping(table, m, stderr);
            isOK=FALSE;
        }
        ++m;
    }

    return isOK;
}